

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O0

bool __thiscall CNetAddr::IsRFC4193(CNetAddr *this)

{
  long lVar1;
  bool bVar2;
  byte *pbVar3;
  undefined8 in_RDI;
  size_type pos;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  uint7 in_stack_ffffffffffffffe8;
  bool bVar4;
  
  pos = (size_type)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsIPv6((CNetAddr *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  bVar4 = false;
  if (bVar2) {
    pbVar3 = prevector<16U,_unsigned_char,_unsigned_int,_int>::operator[]
                       ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                        (ulong)in_stack_ffffffffffffffe8,pos);
    bVar4 = (*pbVar3 & 0xfe) == 0xfc;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CNetAddr::IsRFC4193() const
{
    return IsIPv6() && (m_addr[0] & 0xFE) == 0xFC;
}